

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O3

idx_t duckdb::Contains<unsigned_int,duckdb::ContainsUnaligned>
                (uchar *haystack,idx_t haystack_size,uchar *needle,idx_t needle_size,
                idx_t base_offset)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  idx_t iVar5;
  ulong uVar6;
  
  if ((needle_size <= haystack_size) && (uVar6 = (haystack_size + 1) - needle_size, uVar6 != 0)) {
    uVar1 = *(uint *)needle;
    uVar3 = 0;
    do {
      puVar2 = (uint *)memchr(haystack + uVar3,uVar1 & 0xff,uVar6 - uVar3);
      if (puVar2 == (uint *)0x0) {
        return 0xffffffffffffffff;
      }
      if (uVar1 == *puVar2) {
        if (needle_size < 5) {
          lVar4 = 0;
        }
        else {
          iVar5 = 4;
          lVar4 = 0;
          do {
            lVar4 = lVar4 + (ulong)(*(uchar *)((long)puVar2 + iVar5) == needle[iVar5]);
            iVar5 = iVar5 + 1;
          } while (needle_size != iVar5);
        }
        if (lVar4 == needle_size - 4) {
          return (long)puVar2 + (base_offset - (long)haystack);
        }
      }
      uVar3 = (long)puVar2 + (1 - (long)haystack);
    } while (uVar3 < uVar6);
  }
  return 0xffffffffffffffff;
}

Assistant:

static idx_t Contains(const unsigned char *haystack, idx_t haystack_size, const unsigned char *needle,
                      idx_t needle_size, idx_t base_offset) {
	if (needle_size > haystack_size) {
		// needle is bigger than haystack: haystack cannot contain needle
		return DConstants::INVALID_INDEX;
	}
	haystack_size -= needle_size - 1;
	auto needle_entry = Load<UNSIGNED>(needle);
	for (idx_t offset = 0; offset < haystack_size; offset++) {
		// start off by performing a memchr to find the first character of the
		auto location =
		    static_cast<const unsigned char *>(memchr(haystack + offset, needle[0], haystack_size - offset));
		if (!location) {
			return DConstants::INVALID_INDEX;
		}
		// for this position we first compare the haystack with the needle
		offset = UnsafeNumericCast<idx_t>(location - haystack);
		auto haystack_entry = Load<UNSIGNED>(location);
		if (needle_entry == haystack_entry) {
			if (OP::template MatchRemainder<UNSIGNED>(location, needle, needle_size)) {
				return base_offset + offset;
			}
		}
	}
	return DConstants::INVALID_INDEX;
}